

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crt_abstractions.c
# Opt level: O2

int mallocAndStrcpy_s(char **destination,char *source)

{
  int iVar1;
  size_t sVar2;
  char *dst;
  size_t dstSizeInBytes;
  
  if (source == (char *)0x0 || destination == (char **)0x0) {
    iVar1 = 0x16;
  }
  else {
    sVar2 = strlen(source);
    dstSizeInBytes = sVar2 + 1;
    sVar2 = 0xffffffffffffffff;
    if (dstSizeInBytes != 0) {
      sVar2 = dstSizeInBytes;
    }
    iVar1 = 0xc;
    if (sVar2 != 0xffffffffffffffff) {
      dst = (char *)malloc(sVar2);
      if (dst != (char *)0x0) {
        *destination = dst;
        iVar1 = strcpy_s(dst,dstSizeInBytes,source);
        if (iVar1 == 0) {
          iVar1 = 0;
        }
        else {
          free(dst);
          *destination = (char *)0x0;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int mallocAndStrcpy_s(char** destination, const char* source)
{
    int result;
    int copied_result;
    /*Codes_SRS_CRT_ABSTRACTIONS_99_036: [destination parameter or source parameter is NULL, the error code returned shall be EINVAL and destination shall not be modified.]*/
    if ((destination == NULL) || (source == NULL))
    {
        /*If strDestination or strSource is a NULL pointer[...]these functions return EINVAL */
        result = EINVAL;
    }
    else
    {
        char* temp;
        size_t l = strlen(source);
        size_t malloc_size = safe_add_size_t(l, 1);

        /*Codes_SRS_CRT_ABSTRACTIONS_99_037: [Upon failure to allocate memory for the destination, the function will return ENOMEM.]*/
        if (malloc_size == SIZE_MAX ||
            (temp = (char*)malloc(malloc_size)) == NULL)
        {
            result = ENOMEM;
        }
        else
        {
            *destination = temp;
            /*Codes_SRS_CRT_ABSTRACTIONS_99_039: [mallocAndstrcpy_s shall copy the contents in the address source, including the terminating null character into location specified by the destination pointer after the memory allocation.]*/
            copied_result = strcpy_s(*destination, l + 1, source);
            if (copied_result != 0) /*strcpy_s error*/
            {
                free(*destination);
                *destination = NULL;
                result = copied_result;
            }
            else
            {
                /*Codes_SRS_CRT_ABSTRACTIONS_99_035: [mallocAndstrcpy_s shall return Zero upon success]*/
                result = 0;
            }
        }
    }
    return result;
}